

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O3

ON_Font * __thiscall
ON_Font::GetManagedFont
          (ON_Font *this,double point_size,wchar_t *name,Weight font_weight,Style font_style)

{
  byte bVar1;
  ON_Font *pOVar2;
  undefined7 in_register_00000011;
  double in_XMM1_Qa;
  ON_Font f;
  ON_Font local_d8;
  
  pOVar2 = InstalledFontFromRichTextProperties
                     ((wchar_t *)this,Medium < (Weight)name,
                      (int)CONCAT71(in_register_00000011,font_weight) == 2);
  if (pOVar2 == (ON_Font *)0x0) {
    bVar1 = WindowsLogfontCharSetFromFaceName((wchar_t *)this);
    pOVar2 = GetManagedFont(point_size,(wchar_t *)this,(Weight)name,font_weight,
                            Default.m_font_stretch,Default.m_font_bUnderlined,
                            Default.m_font_bStrikethrough,in_XMM1_Qa,(uint)bVar1);
  }
  else if ((point_size <= 0.0) || (256.0 <= point_size)) {
    if (pOVar2->m_runtime_serial_number == 0) {
      pOVar2 = ON_ManagedFonts::GetFromFontCharacteristics(&ON_ManagedFonts::List,pOVar2,true);
      return pOVar2;
    }
  }
  else {
    ON_Font(&local_d8,pOVar2);
    pOVar2 = &local_d8;
    local_d8.m_point_size = point_size;
    if (local_d8.m_runtime_serial_number == 0) {
      pOVar2 = ON_ManagedFonts::GetFromFontCharacteristics(&ON_ManagedFonts::List,&local_d8,true);
    }
    ~ON_Font(&local_d8);
  }
  return pOVar2;
}

Assistant:

const ON_Font* ON_Font::GetManagedFont(
  double point_size,
  const wchar_t* name,
  ON_Font::Weight font_weight,
  ON_Font::Style font_style
  )
{
  // Using ON_Font::InstalledFontFromRichTextProperties() fixes lots 
  // of RTF parsing bugs including RH-49028 and "Arial Black" bugs.
  // Depending on the context, name can be LOGFONT, PostScript, Family+Face, Family, ...
  // The font_weight parameter is typically a "face" indication. 
  // Treating it as a literal value causes more bugs than it fixes.
  const ON_Font* installed_font = ON_Font::InstalledFontFromRichTextProperties(
    name, 
    ON_Font::IsBoldWeight(font_weight), 
    (ON_Font::Style::Italic == font_style)
  );
  if (nullptr != installed_font)
  {
    if (point_size > 0.0 && point_size < ON_Font::AnnotationFontApplePointSize)
    {
      ON_Font f(*installed_font);
      f.m_point_size = point_size;
      return f.ManagedFont();
    }
    return installed_font->ManagedFont();
  }

  // Less reliable approach
  const unsigned int logfont_charset = static_cast<unsigned int>(ON_Font::WindowsLogfontCharSetFromFaceName(name));

  return ON_Font::GetManagedFont(
    point_size,
    name, 
    font_weight,
    font_style,
    ON_Font::Default.m_font_stretch,
    ON_Font::Default.m_font_bUnderlined,
    ON_Font::Default.m_font_bStrikethrough,
    ON_FontMetrics::DefaultLineFeedRatio,
    logfont_charset
    );
}